

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  GeneratorOptions *options_00;
  string *value1;
  string *descriptor;
  undefined1 *field_00;
  int i;
  int i_00;
  FieldDescriptor *field_01;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  char *pcVar3;
  BytesMode in_R8D;
  undefined1 in_R9B;
  BytesMode bytes_mode;
  string typed_annotation;
  string local_68;
  string local_48;
  
  value1 = &typed_annotation;
  descriptor = &typed_annotation;
  bVar1 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)options);
  if (bVar1) {
    bytes_mode = 0x2280a6;
    TVar2 = FieldDescriptor::type(field);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10) goto LAB_002280b9;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,false,bytes_mode);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)field,field_01);
    pcVar3 = "  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n";
    value1 = &local_68;
    io::Printer::Print(printer,
                       "  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n",
                       "index",value1,"type",&typed_annotation);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0022813e;
  }
  else {
LAB_002280b9:
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x2,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    bVar1 = FieldDescriptor::is_map(field);
    pcVar3 = "";
    if (bVar1) {
      pcVar3 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar3,pcVar3 + (ulong)bVar1 * 4);
    pcVar3 = "  f = message.get$name$($nolazy$);\n";
    io::Printer::Print(printer,"  f = message.get$name$($nolazy$);\n","name",&typed_annotation,
                       "nolazy",&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0022813e;
  }
  pcVar3 = (char *)(local_68.field_2._M_allocated_capacity + 1);
  operator_delete(local_68._M_dataplus._M_p,(ulong)pcVar3);
LAB_0022813e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) {
    pcVar3 = (char *)(typed_annotation.field_2._M_allocated_capacity + 1);
    operator_delete(typed_annotation._M_dataplus._M_p,(ulong)pcVar3);
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pcVar3 = "  if (f && f.getLength() > 0) {\n";
  }
  else if (*(int *)(field + 0x4c) == 3) {
    pcVar3 = "  if (f.length > 0) {\n";
  }
  else {
    bVar1 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)pcVar3);
    if (bVar1) {
      pcVar3 = "  if (f != null) {\n";
    }
    else {
      TVar2 = FieldDescriptor::type(field);
      if (8 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) - 1U) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                      ,0xbbe,
                      "void google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField(const GeneratorOptions &, io::Printer *, const FieldDescriptor *) const"
                     );
      }
      value1 = (string *)&DAT_003583dc;
      pcVar3 = &DAT_003583dc +
               *(int *)(&DAT_003583dc +
                       (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) - 1U)
                       * 4);
    }
  }
  io::Printer::Print(printer,pcVar3);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    SimpleItoa_abi_cxx11_(&typed_annotation,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)this_00,options_01,(FieldDescriptor *)value1);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)this_01,options_02,(FieldDescriptor *)value1);
    io::Printer::Print(printer,
                       "    f.serializeBinary($index$, writer, $keyWriterFn$, $valueWriterFn$",
                       "index",&typed_annotation,"keyWriterFn",&local_68,"valueWriterFn",&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) {
      operator_delete(typed_annotation._M_dataplus._M_p,
                      typed_annotation.field_2._M_allocated_capacity + 1);
    }
    TVar2 = FieldDescriptor::type(this_01);
    pcVar3 = ");\n";
    if (TVar2 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&typed_annotation,(_anonymous_namespace_ *)options,options_00,
                 (Descriptor *)descriptor);
      io::Printer::Print(printer,", $messageType$.serializeBinaryToWriter","messageType",
                         &typed_annotation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) {
        operator_delete(typed_annotation._M_dataplus._M_p,
                        typed_annotation.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x1,
               SUB81(value1,0));
    SimpleItoa_abi_cxx11_(&local_68,(protobuf *)(ulong)*(uint *)(field + 0x38),i_00);
    io::Printer::Print(printer,"    writer.write$method$(\n      $index$,\n      f","method",
                       &typed_annotation,"index",&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) {
      operator_delete(typed_annotation._M_dataplus._M_p,
                      typed_annotation.field_2._M_allocated_capacity + 1);
    }
    TVar2 = FieldDescriptor::type(field);
    field_00 = FieldDescriptor::kTypeToCppTypeMap;
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) ||
       (bVar1 = FieldDescriptor::is_map(field), bVar1)) {
      io::Printer::Print(printer,"\n");
    }
    else {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)field_00);
      io::Printer::Print(printer,",\n      $submsg$.serializeBinaryToWriter\n","submsg",
                         &typed_annotation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)typed_annotation._M_dataplus._M_p != &typed_annotation.field_2) {
        operator_delete(typed_annotation._M_dataplus._M_p,
                        typed_annotation.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = "    );\n";
  }
  io::Printer::Print(printer,pcVar3);
  io::Printer::Print(printer,"  }\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    string typed_annotation = JSFieldTypeAnnotation(
        options, field,
        /* is_setter_argument = */ false,
        /* force_present = */ false,
        /* singular_if_not_packed = */ false,
        /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field),
        "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n",
        "name", JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", IsMap(options, field) ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (IsMap(options, field)) {
    printer->Print(
        "  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print(
        "  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print(
          "  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print(
              "  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print(
              "  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print(
              "  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
                              "$keyWriterFn$, $valueWriterFn$",
        "index", SimpleItoa(field->number()),
        "keyWriterFn", JSBinaryWriterMethodName(options, key_field),
        "valueWriterFn", JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", SimpleItoa(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsMap(options, field)) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
        "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print(
        "    );\n");
  }

  // Close the `if`.
  printer->Print(
      "  }\n");
}